

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake_scanner.h
# Opt level: O0

void __thiscall CMakeScanner::~CMakeScanner(CMakeScanner *this)

{
  CMakeScanner *this_local;
  
  if (this->file != (FILE *)0x0) {
    fclose((FILE *)this->file);
  }
  if (this->stringBuf != (YY_BUFFER_STATE)0x0) {
    yy_delete_buffer(this->stringBuf,this->yyscanner);
  }
  yylex_destroy(this->yyscanner);
  ScannerCtx::~ScannerCtx(&this->scannerCtx);
  return;
}

Assistant:

~CMakeScanner()
    {
        if(file)
        {
            fclose(file);
        }

        if(stringBuf)
        {
            yy_delete_buffer(stringBuf, yyscanner);
        }

        yylex_destroy(yyscanner);
    }